

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O1

error<idx2::err_code> idx2::ReadMetaData(cstr FileName,metadata *Meta)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  char *__s;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  dtype dVar6;
  err_code eVar7;
  int iVar8;
  anon_union_8_2_2df48d06_for_stref_0 aVar9;
  long lVar10;
  long lVar11;
  name_map *pnVar12;
  uint uVar13;
  long lVar14;
  undefined8 uVar15;
  v3i *Result;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar16;
  stref sVar17;
  error<idx2::err_code> eVar18;
  stref NameStr;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_DataSet_cpp:83:3)>
  __ScopeGuard__0;
  anon_union_8_2_2df48d06_for_stref_0 local_128;
  int local_120;
  anon_union_8_2_2df48d06_for_stref_0 local_118;
  undefined8 uStack_110;
  char *local_108;
  undefined4 local_100;
  undefined4 local_f8;
  cstr local_f0;
  anon_union_8_2_2df48d06_for_stref_0 local_e8;
  int iStack_e0;
  undefined4 uStack_dc;
  anon_union_8_2_2df48d06_for_stref_0 local_d8;
  int local_d0;
  anon_union_8_2_2df48d06_for_stref_0 local_c8;
  buffer *local_c0;
  char local_b8;
  v3i *local_b0;
  anon_union_8_2_2df48d06_for_stref_0 local_a8;
  anon_union_8_2_2df48d06_for_stref_0 local_a0;
  int local_98;
  char *local_90;
  undefined4 local_88;
  undefined4 local_80;
  buffer local_78;
  anon_union_8_2_2df48d06_for_stref_0 local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  undefined4 local_38;
  
  if (Mallocator()::Instance == '\0') {
    ReadMetaData();
  }
  local_78.Data = (byte *)0x0;
  local_78.Bytes = 0;
  local_78.Alloc = (allocator *)&Mallocator()::Instance;
  eVar16 = ReadFile(FileName,&local_78);
  uVar15 = eVar16._8_8_;
  local_f0 = eVar16.Msg;
  if (eVar16.Code == NoError) {
    local_b8 = '\0';
    local_58.Ptr = (str)local_78.Data;
    local_50 = (undefined4)local_78.Bytes;
    local_48 = "\r\n";
    local_40 = 2;
    local_38 = 0;
    local_c0 = &local_78;
    sVar17 = Next((tokenizer *)&local_58);
    aVar9 = sVar17.field_0;
    iVar8 = sVar17.Size;
    puVar1 = (undefined8 *)(*in_FS_OFFSET + -0x400);
    puVar2 = (undefined4 *)(*in_FS_OFFSET + -0x200);
    __s = (char *)(*in_FS_OFFSET + -0xf80);
    local_b0 = &Meta->Dims3;
    local_a8.Ptr = Meta->Field;
    local_f0 = "File %s";
LAB_0010b84a:
    if (aVar9.Ptr != (str)0x0) {
      local_90 = "=";
      local_88 = 1;
      local_80 = 0;
      local_a0 = aVar9;
      local_98 = iVar8;
      sVar17 = Next((tokenizer *)&local_a0);
      local_118 = sVar17.field_0;
      uStack_110._0_4_ = sVar17.Size;
      sVar17 = Trim((stref *)&local_118);
      local_d8 = sVar17.field_0;
      local_d0 = sVar17.Size;
      sVar17 = Next((tokenizer *)&local_a0);
      local_118 = sVar17.field_0;
      uStack_110 = CONCAT44(uStack_110._4_4_,sVar17.Size);
      sVar17 = Trim((stref *)&local_118);
      local_e8 = sVar17.field_0;
      iStack_e0 = sVar17.Size;
      if (local_d8.Ptr != (str)0x0 && (metadata *)local_e8.Ptr != (metadata *)0x0) {
        local_118.Ptr = "name";
        uStack_110._0_4_ = 4;
        bVar4 = operator==((stref *)&local_d8,(stref *)&local_118);
        if (bVar4) {
          uStack_110 = CONCAT44(uStack_110._4_4_,0x3f);
          local_118 = (anon_union_8_2_2df48d06_for_stref_0)Meta;
          sVar17 = Trim((stref *)&local_e8);
          local_128 = sVar17.field_0;
          local_120 = sVar17.Size;
          Copy((stref *)&local_128,(stref *)&local_118,true);
LAB_0010ba00:
          bVar4 = true;
          goto LAB_0010ba8f;
        }
        local_118.Ptr = "field";
        uStack_110._0_4_ = 5;
        bVar4 = operator==((stref *)&local_d8,(stref *)&local_118);
        if (bVar4) {
          local_118 = local_a8;
          uStack_110 = CONCAT44(uStack_110._4_4_,0x3f);
          sVar17 = Trim((stref *)&local_e8);
          local_128 = sVar17.field_0;
          local_120 = sVar17.Size;
          Copy((stref *)&local_128,(stref *)&local_118,true);
          goto LAB_0010ba00;
        }
        local_118.Ptr = "dimensions";
        uStack_110._0_4_ = 10;
        bVar4 = operator==((stref *)&local_d8,(stref *)&local_118);
        if (!bVar4) {
          local_118.Ptr = "type";
          uStack_110 = CONCAT44(uStack_110._4_4_,4);
          bVar4 = operator==((stref *)&local_d8,(stref *)&local_118);
          if (bVar4) {
            sVar17.Size = iStack_e0;
            sVar17.field_0.Ptr = local_e8.Ptr;
            sVar17._12_4_ = 0;
            dVar6 = StringTo<idx2::dtype>::operator()((StringTo<idx2::dtype> *)&local_118,sVar17);
            *(dtype *)((long)Meta + 0x8c) = dVar6;
            bVar4 = true;
            if (dVar6 == __Invalid__) {
              *puVar1 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
              ;
              *puVar2 = 0x7b;
              eVar7 = err_code_s::NameMap.Arr[0].ItemVal;
              if (err_code_s::NameMap.Arr[0].ItemVal != TypeNotSupported) {
                lVar14 = 0;
                do {
                  if (lVar14 == 0x1e0) {
                    eVar7 = __Invalid__;
                    goto LAB_0010be5b;
                  }
                  piVar3 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar14);
                  lVar14 = lVar14 + 0x18;
                } while (*piVar3 != 9);
                eVar7 = TypeNotSupported;
              }
LAB_0010be5b:
              pnVar12 = &err_code_s::NameMap;
              if (err_code_s::NameMap.Arr[0].ItemVal != eVar7) {
                lVar14 = 0;
                do {
                  lVar11 = lVar14;
                  if (lVar11 == 0x1e0) goto LAB_0010bff5;
                  lVar14 = lVar11 + 0x18;
                } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar11) != eVar7)
                ;
                pnVar12 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar11);
              }
              bVar4 = false;
              iVar8 = snprintf(__s,0x400,"%.*s (file %s, line %d): ",
                               (ulong)(uint)pnVar12->Arr[0].Name.Size,
                               pnVar12->Arr[0].Name.field_0.Ptr,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                               ,0x7b);
              snprintf(__s + iVar8,0x400 - (long)iVar8,"File %s",FileName);
              uVar15 = 0x10000000009;
            }
          }
          else {
            *puVar1 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
            ;
            *puVar2 = 0x7f;
            eVar7 = err_code_s::NameMap.Arr[0].ItemVal;
            if (err_code_s::NameMap.Arr[0].ItemVal != AttributeNotFound) {
              lVar14 = 0;
              do {
                if (lVar14 == 0x1e0) {
                  eVar7 = __Invalid__;
                  goto LAB_0010bca7;
                }
                piVar3 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar14);
                lVar14 = lVar14 + 0x18;
              } while (*piVar3 != 7);
              eVar7 = AttributeNotFound;
            }
LAB_0010bca7:
            pnVar12 = &err_code_s::NameMap;
            if (err_code_s::NameMap.Arr[0].ItemVal != eVar7) {
              lVar14 = 0;
              do {
                lVar11 = lVar14;
                if (lVar11 == 0x1e0) goto LAB_0010bff5;
                lVar14 = lVar11 + 0x18;
              } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar11) != eVar7);
              pnVar12 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar11);
            }
            bVar4 = false;
            iVar8 = snprintf(__s,0x400,"%.*s (file %s, line %d): ",
                             (ulong)(uint)pnVar12->Arr[0].Name.Size,pnVar12->Arr[0].Name.field_0.Ptr
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                             ,0x7f);
            snprintf(__s + iVar8,0x400 - (long)iVar8,"File %s",FileName);
            uVar15 = 0x10000000007;
          }
          goto LAB_0010ba8f;
        }
        uStack_110 = CONCAT44(uStack_dc,iStack_e0);
        local_118.Ptr = local_e8.Ptr;
        local_108 = " ";
        local_100 = 1;
        local_f8 = 0;
        local_c8 = (anon_union_8_2_2df48d06_for_stref_0)Meta;
        sVar17 = Next((tokenizer *)&local_118);
        local_128 = sVar17.field_0;
        local_120 = sVar17.Size;
        bVar4 = local_128.Ptr != (str)0x0;
        if (local_128.Ptr == (str)0x0) {
          lVar14 = 0;
        }
        else {
          lVar14 = 0;
          Result = local_b0;
          do {
            if (lVar14 == 3) {
              __assert_fail("Idx < 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
            }
            bVar5 = ToInt((stref *)&local_128,(int *)Result);
            if (!bVar5) {
              *puVar1 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
              ;
              *puVar2 = 0x6f;
              eVar7 = err_code_s::NameMap.Arr[0].ItemVal;
              if (err_code_s::NameMap.Arr[0].ItemVal == ParseFailed) goto LAB_0010bd37;
              lVar11 = 0;
              goto LAB_0010bc82;
            }
            sVar17 = Next((tokenizer *)&local_118);
            local_128 = sVar17.field_0;
            local_120 = sVar17.Size;
            lVar14 = lVar14 + 1;
            Result = (v3i *)&(Result->field_0).field_0.Y;
            bVar4 = local_128.Ptr != (str)0x0;
          } while (bVar4);
        }
        goto LAB_0010bdb8;
      }
      *puVar1 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
      ;
      *puVar2 = 0x5c;
      eVar7 = err_code_s::NameMap.Arr[0].ItemVal;
      if (err_code_s::NameMap.Arr[0].ItemVal != ParseFailed) {
        lVar14 = 0;
        do {
          if (lVar14 == 0x1e0) {
            eVar7 = __Invalid__;
            goto LAB_0010ba0d;
          }
          piVar3 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar14);
          lVar14 = lVar14 + 0x18;
        } while (*piVar3 != 0x11);
        eVar7 = ParseFailed;
      }
LAB_0010ba0d:
      pnVar12 = &err_code_s::NameMap;
      if (err_code_s::NameMap.Arr[0].ItemVal != eVar7) {
        lVar14 = 0;
        do {
          lVar11 = lVar14;
          if (lVar11 == 0x1e0) {
LAB_0010bff5:
            __assert_fail("It != End(EnumS.NameMap)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/ErrorCodes.h"
                          ,0xc,"stref idx2::ToString(err_code)");
          }
          lVar14 = lVar11 + 0x18;
        } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar11) != eVar7);
        pnVar12 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar11);
      }
      bVar4 = false;
      iVar8 = snprintf(__s,0x400,"%.*s (file %s, line %d): ",(ulong)(uint)pnVar12->Arr[0].Name.Size,
                       pnVar12->Arr[0].Name.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                       ,0x5c);
      snprintf(__s + iVar8,0x400 - (long)iVar8,"File %s",FileName);
      uVar15 = 0x10000000011;
      goto LAB_0010ba8f;
    }
LAB_0010bf76:
    if (aVar9.Ptr == (str)0x0) {
      *(char **)(*in_FS_OFFSET + -0x400) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x82;
      local_f0 = "";
      uVar15 = 0;
    }
    eVar16.Code = (int)uVar15;
    eVar16.StackIdx = (char)((ulong)uVar15 >> 0x20);
    eVar16.StrGened = (bool)(char)((ulong)uVar15 >> 0x28);
    eVar16._14_2_ = (short)((ulong)uVar15 >> 0x30);
    eVar16.Msg = local_f0;
    if (local_b8 == '\0') {
      DeallocBuf(local_c0);
      eVar16.Code = (int)uVar15;
      eVar16.StackIdx = (char)((ulong)uVar15 >> 0x20);
      eVar16.StrGened = (bool)(char)((ulong)uVar15 >> 0x28);
      eVar16._14_2_ = (short)((ulong)uVar15 >> 0x30);
      eVar16.Msg = local_f0;
    }
  }
  local_f0 = eVar16.Msg;
  eVar18._8_8_ = eVar16._8_8_ & 0xffffffffffff;
  eVar18.Msg = local_f0;
  return eVar18;
  while (piVar3 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar11),
        lVar11 = lVar11 + 0x18, *piVar3 != 0x11) {
LAB_0010bc82:
    if (lVar11 == 0x1e0) {
      eVar7 = __Invalid__;
      goto LAB_0010bd37;
    }
  }
  eVar7 = ParseFailed;
LAB_0010bd37:
  pnVar12 = &err_code_s::NameMap;
  if (err_code_s::NameMap.Arr[0].ItemVal != eVar7) {
    lVar11 = 0;
    do {
      lVar10 = lVar11;
      if (lVar10 == 0x1e0) goto LAB_0010bff5;
      lVar11 = lVar10 + 0x18;
    } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar10) != eVar7);
    pnVar12 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar10);
  }
  iVar8 = snprintf(__s,0x400,"%.*s (file %s, line %d): ",(ulong)(uint)pnVar12->Arr[0].Name.Size,
                   pnVar12->Arr[0].Name.field_0.Ptr,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                   ,0x6f);
  snprintf(__s + iVar8,0x400 - (long)iVar8,"File %s",FileName);
  uVar15 = 0x10000000011;
LAB_0010bdb8:
  Meta = (metadata *)local_c8;
  if (bVar4) {
    bVar4 = false;
  }
  else {
    uVar13 = (uint)lVar14;
    if (uVar13 < 4) {
      if (uVar13 != 3) {
        *(char *)((long)local_c8.Ptr + 0x88) = '\x01';
        *(char *)((long)local_c8.Ptr + 0x89) = '\0';
        *(char *)((long)local_c8.Ptr + 0x8a) = '\0';
        *(char *)((long)local_c8.Ptr + 0x8b) = '\0';
      }
      bVar4 = true;
      if (uVar13 < 2) {
        *(char *)((long)local_c8.Ptr + 0x84) = '\x01';
        *(char *)((long)local_c8.Ptr + 0x85) = '\0';
        *(char *)((long)local_c8.Ptr + 0x86) = '\0';
        *(char *)((long)local_c8.Ptr + 0x87) = '\0';
      }
    }
    else {
      *puVar1 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
      ;
      *puVar2 = 0x72;
      eVar7 = err_code_s::NameMap.Arr[0].ItemVal;
      if (err_code_s::NameMap.Arr[0].ItemVal != DimensionsTooMany) {
        lVar14 = 0;
        do {
          if (lVar14 == 0x1e0) {
            eVar7 = __Invalid__;
            goto LAB_0010beeb;
          }
          piVar3 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar14);
          lVar14 = lVar14 + 0x18;
        } while (*piVar3 != 6);
        eVar7 = DimensionsTooMany;
      }
LAB_0010beeb:
      pnVar12 = &err_code_s::NameMap;
      if (err_code_s::NameMap.Arr[0].ItemVal != eVar7) {
        lVar14 = 0;
        do {
          lVar11 = lVar14;
          if (lVar11 == 0x1e0) goto LAB_0010bff5;
          lVar14 = lVar11 + 0x18;
        } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar11) != eVar7);
        pnVar12 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar11);
      }
      bVar4 = false;
      iVar8 = snprintf(__s,0x400,"%.*s (file %s, line %d): ",(ulong)(uint)pnVar12->Arr[0].Name.Size,
                       pnVar12->Arr[0].Name.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                       ,0x72);
      snprintf(__s + iVar8,0x400 - (long)iVar8,"File %s",FileName);
      uVar15 = 0x10000000006;
    }
  }
LAB_0010ba8f:
  if (!bVar4) goto LAB_0010bf76;
  sVar17 = Next((tokenizer *)&local_58);
  aVar9 = sVar17.field_0;
  iVar8 = sVar17.Size;
  goto LAB_0010b84a;
}

Assistant:

error<>
ReadMetaData(cstr FileName, metadata* Meta)
{
  buffer Buf;
  error Ok = ReadFile(FileName, &Buf);
  if (Ok.Code != err_code::NoError)
    return Ok;
  idx2_CleanUp(0, DeallocBuf(&Buf));
  stref Str((cstr)Buf.Data, (int)Buf.Bytes);
  tokenizer TkLine(Str, "\r\n");
  for (stref Line = Next(&TkLine); Line; Line = Next(&TkLine))
  {
    tokenizer TkEq(Line, "=");
    stref Attr = Trim(Next(&TkEq));
    stref Value = Trim(Next(&TkEq));
    if (!Attr || !Value)
      return idx2_Error(err_code::ParseFailed, "File %s", FileName);

    if (Attr == "name")
    {
      stref NameStr = idx2_StRef(Meta->Name);
      Copy(Trim(Value), &NameStr);
    }
    else if (Attr == "field")
    {
      stref FieldStr = idx2_StRef(Meta->Field);
      Copy(Trim(Value), &FieldStr);
    }
    else if (Attr == "dimensions")
    {
      tokenizer TkSpace(Value, " ");
      int D = 0;
      for (stref Dim = Next(&TkSpace); Dim && D < 4; Dim = Next(&TkSpace), ++D)
      {
        if (!ToInt(Dim, &Meta->Dims3[D]))
          return idx2_Error(err_code::ParseFailed, "File %s", FileName);
      }
      if (D >= 4)
        return idx2_Error(err_code::DimensionsTooMany, "File %s", FileName);
      if (D <= 2)
        Meta->Dims3[2] = 1;
      if (D <= 1)
        Meta->Dims3[1] = 1;
    }
    else if (Attr == "type")
    {
      if ((Meta->DType = StringTo<dtype>()(Value)) == dtype::__Invalid__)
        return idx2_Error(err_code::TypeNotSupported, "File %s", FileName);
    }
    else
    {
      return idx2_Error(err_code::AttributeNotFound, "File %s", FileName);
    }
  }
  return idx2_Error(err_code::NoError);
}